

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Own<kj::File> __thiscall kj::newInMemoryFile(kj *this,Clock *clock)

{
  File *extraout_RDX;
  Own<kj::File> OVar1;
  Own<kj::(anonymous_namespace)::InMemoryFile> local_28;
  Clock *local_18;
  Clock *clock_local;
  
  local_18 = clock;
  clock_local = (Clock *)this;
  atomicRefcounted<kj::(anonymous_namespace)::InMemoryFile,kj::Clock_const&>((kj *)&local_28,clock);
  Own<kj::File>::Own<kj::(anonymous_namespace)::InMemoryFile,void>((Own<kj::File> *)this,&local_28);
  Own<kj::(anonymous_namespace)::InMemoryFile>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<File> newInMemoryFile(const Clock& clock) {
  return atomicRefcounted<InMemoryFile>(clock);
}